

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3AuthCheck(Parse *pParse,int code,char *zArg1,char *zArg2,char *zArg3)

{
  sqlite3 *psVar1;
  int iVar2;
  uint uVar3;
  
  psVar1 = pParse->db;
  iVar2 = 0;
  if (((psVar1->xAuth != (sqlite3_xauth)0x0) && ((psVar1->init).busy == '\0')) &&
     (pParse->eParseMode == '\0')) {
    uVar3 = (*psVar1->xAuth)(psVar1->pAuthArg,code,zArg1,zArg2,zArg3,pParse->zAuthContext);
    if (uVar3 == 1) {
      sqlite3ErrorMsg(pParse,"not authorized");
      pParse->rc = 0x17;
    }
    else {
      if ((uVar3 & 0xfffffffd) == 0) {
        return uVar3;
      }
      sqliteAuthBadReturnCode(pParse);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3AuthCheck(
  Parse *pParse,
  int code,
  const char *zArg1,
  const char *zArg2,
  const char *zArg3
){
  sqlite3 *db = pParse->db;
  int rc;

  /* Don't do any authorization checks if the database is initializing
  ** or if the parser is being invoked from within sqlite3_declare_vtab.
  */
  assert( !IN_RENAME_OBJECT || db->xAuth==0 );
  if( db->xAuth==0 || db->init.busy || IN_SPECIAL_PARSE ){
    return SQLITE_OK;
  }

  /* EVIDENCE-OF: R-43249-19882 The third through sixth parameters to the
  ** callback are either NULL pointers or zero-terminated strings that
  ** contain additional details about the action to be authorized.
  **
  ** The following testcase() macros show that any of the 3rd through 6th
  ** parameters can be either NULL or a string. */
  testcase( zArg1==0 );
  testcase( zArg2==0 );
  testcase( zArg3==0 );
  testcase( pParse->zAuthContext==0 );

  rc = db->xAuth(db->pAuthArg,code,zArg1,zArg2,zArg3,pParse->zAuthContext);
  if( rc==SQLITE_DENY ){
    sqlite3ErrorMsg(pParse, "not authorized");
    pParse->rc = SQLITE_AUTH;
  }else if( rc!=SQLITE_OK && rc!=SQLITE_IGNORE ){
    rc = SQLITE_DENY;
    sqliteAuthBadReturnCode(pParse);
  }
  return rc;
}